

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O2

void __thiscall proto3::MapM::~MapM(MapM *this)

{
  ~MapM(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

MapM::~MapM() {
  // @@protoc_insertion_point(destructor:proto3.MapM)
  SharedDtor(*this);
}